

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O0

pair<unsigned_long,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::InsertionState>
 __thiscall
robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>::
insertKeyPrepareEmptySpot<char_const&>
          (Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_> *this
          ,char *key)

{
  InfoType IVar1;
  size_t insertion_idx_00;
  bool bVar2;
  type __y;
  InsertionState *in_RSI;
  Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_> *in_RDI;
  pair<unsigned_long,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::InsertionState>
  pVar3;
  InfoType insertion_info;
  size_t insertion_idx;
  InfoType info;
  size_t idx;
  int i;
  InsertionState *in_stack_ffffffffffffff48;
  Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
  *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
  *in_stack_ffffffffffffff70;
  uint8_t local_74;
  InfoType local_34;
  size_t local_30;
  int local_24;
  InsertionState *local_20;
  unsigned_long local_10;
  InsertionState local_8;
  
  local_24 = 0;
  local_20 = in_RSI;
  do {
    if (0xff < local_24) {
      pVar3 = std::
              make_pair<unsigned_long,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>::InsertionState>
                        (&in_RDI->mHashMultiplier,in_stack_ffffffffffffff48);
      local_10 = pVar3.first;
      local_8 = pVar3.second;
LAB_00115923:
      pVar3.second = local_8;
      pVar3.first = local_10;
      pVar3._12_4_ = 0;
      return pVar3;
    }
    local_30 = 0;
    local_34 = 0;
    keyToIdx<char_const&>
              (in_stack_ffffffffffffff70,
               (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               (size_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (InfoType *)in_stack_ffffffffffffff58);
    Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
    nextWhileLess((Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
                   *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                  (InfoType *)in_stack_ffffffffffffff58,&in_RDI->mHashMultiplier);
    while (insertion_idx_00 = local_30, IVar1 = local_34, local_34 == in_RDI->mInfo[local_30]) {
      in_stack_ffffffffffffff48 = local_20;
      __y = DataNode<robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,true>
            ::getFirst<robin_hood::pair<char,double>>
                      ((DataNode<robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,true>
                        *)(in_RDI->mKeyVals + local_30));
      bVar2 = std::equal_to<char>::operator()
                        ((equal_to<char> *)in_RDI,(char *)in_stack_ffffffffffffff48,__y);
      if (bVar2) {
        pVar3 = std::
                make_pair<unsigned_long&,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>::InsertionState>
                          (&in_RDI->mHashMultiplier,in_stack_ffffffffffffff48);
        local_10 = pVar3.first;
        local_8 = pVar3.second;
        goto LAB_00115923;
      }
      Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::next
                (in_RDI,&local_34,&local_30);
    }
    if (in_RDI->mNumElements < in_RDI->mMaxNumElementsAllowed) {
      if (0xff < local_34 + in_RDI->mInfoInc) {
        in_RDI->mMaxNumElementsAllowed = 0;
      }
      while (in_RDI->mInfo[local_30] != '\0') {
        Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::next
                  (in_RDI,&local_34,&local_30);
      }
      if (local_30 != insertion_idx_00) {
        Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::shiftUp
                  (in_RDI,local_30,insertion_idx_00);
      }
      local_74 = (uint8_t)IVar1;
      in_RDI->mInfo[insertion_idx_00] = local_74;
      in_RDI->mNumElements = in_RDI->mNumElements + 1;
      pVar3 = std::
              make_pair<unsigned_long_const&,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>::InsertionState>
                        (&in_RDI->mHashMultiplier,in_stack_ffffffffffffff48);
      local_10 = pVar3.first;
      local_8 = pVar3.second;
      goto LAB_00115923;
    }
    bVar2 = Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
            increase_size(in_stack_ffffffffffffff58);
    if (!bVar2) {
      pVar3 = std::
              make_pair<unsigned_long,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>::InsertionState>
                        (&in_RDI->mHashMultiplier,in_stack_ffffffffffffff48);
      local_10 = pVar3.first;
      local_8 = pVar3.second;
      goto LAB_00115923;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

std::pair<size_t, InsertionState> insertKeyPrepareEmptySpot(OtherKey&& key) {
        for (int i = 0; i < 256; ++i) {
            size_t idx{};
            InfoType info{};
            keyToIdx(key, &idx, &info);
            nextWhileLess(&info, &idx);

            // while we potentially have a match
            while (info == mInfo[idx]) {
                if (WKeyEqual::operator()(key, mKeyVals[idx].getFirst())) {
                    // key already exists, do NOT insert.
                    // see http://en.cppreference.com/w/cpp/container/unordered_map/insert
                    return std::make_pair(idx, InsertionState::key_found);
                }
                next(&info, &idx);
            }

            // unlikely that this evaluates to true
            if (ROBIN_HOOD_UNLIKELY(mNumElements >= mMaxNumElementsAllowed)) {
                if (!increase_size()) {
                    return std::make_pair(size_t(0), InsertionState::overflow_error);
                }
                continue;
            }

            // key not found, so we are now exactly where we want to insert it.
            auto const insertion_idx = idx;
            auto const insertion_info = info;
            if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }

            // find an empty spot
            while (0 != mInfo[idx]) {
                next(&info, &idx);
            }

            if (idx != insertion_idx) {
                shiftUp(idx, insertion_idx);
            }
            // put at empty spot
            mInfo[insertion_idx] = static_cast<uint8_t>(insertion_info);
            ++mNumElements;
            return std::make_pair(insertion_idx, idx == insertion_idx
                                                     ? InsertionState::new_node
                                                     : InsertionState::overwrite_node);
        }

        // enough attempts failed, so finally give up.
        return std::make_pair(size_t(0), InsertionState::overflow_error);
    }